

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

optional<cmLinkItem> * __thiscall
cmGeneratorTarget::LookupLinkItem
          (optional<cmLinkItem> *__return_storage_ptr__,cmGeneratorTarget *this,string *n,
          cmListFileBacktrace *bt,LookupLinkItemScope *scope,LookupSelf lookupSelf)

{
  bool bVar1;
  __type _Var2;
  string *__rhs;
  string name;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_f0;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0;
  cmLinkItem local_70;
  
  (__return_storage_ptr__->super__Optional_base<cmLinkItem,_false,_false>)._M_payload.
  super__Optional_payload<cmLinkItem,_true,_false,_false>.super__Optional_payload_base<cmLinkItem>.
  _M_engaged = false;
  bVar1 = IsLinkLookupScope(this,n,&scope->LG);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  CheckCMP0004(&local_e0,this,n);
  if (local_e0._M_string_length != 0) {
    if (lookupSelf == No) {
      __rhs = GetName_abi_cxx11_(this);
      _Var2 = std::operator==(&local_e0,__rhs);
      if (_Var2) goto LAB_00348b59;
    }
    std::__cxx11::string::string((string *)&local_c0,(string *)&local_e0);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_f0,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)bt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_a0,&local_c0,(cmListFileBacktrace *)&local_f0);
    ResolveLinkItem(&local_70,this,&local_a0,scope->LG);
    std::optional<cmLinkItem>::operator=(__return_storage_ptr__,&local_70);
    cmLinkItem::~cmLinkItem(&local_70);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    std::__cxx11::string::~string((string *)&local_c0);
  }
LAB_00348b59:
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmLinkItem> cmGeneratorTarget::LookupLinkItem(
  std::string const& n, cmListFileBacktrace const& bt,
  LookupLinkItemScope* scope, LookupSelf lookupSelf) const
{
  cm::optional<cmLinkItem> maybeItem;
  if (this->IsLinkLookupScope(n, scope->LG)) {
    return maybeItem;
  }

  std::string name = this->CheckCMP0004(n);
  if (name.empty() ||
      (lookupSelf == LookupSelf::No && name == this->GetName())) {
    return maybeItem;
  }
  maybeItem = this->ResolveLinkItem(BT<std::string>(name, bt), scope->LG);
  return maybeItem;
}